

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O3

int array_container_intersection_cardinality(array_container_t *array1,array_container_t *array2)

{
  int iVar1;
  int iVar2;
  int32_t iVar3;
  uint uVar4;
  size_t size_l;
  uint16_t *large;
  size_t s_b;
  uint16_t *small;
  size_t s_a;
  
  iVar1 = array1->cardinality;
  s_a = (size_t)iVar1;
  iVar2 = array2->cardinality;
  s_b = (size_t)iVar2;
  if (iVar1 * 0x40 < iVar2) {
    small = array1->array;
    large = array2->array;
    size_l = s_b;
    s_b = s_a;
  }
  else {
    if (iVar1 <= iVar2 * 0x40) {
      uVar4 = croaring_hardware_support();
      if ((uVar4 & 1) == 0) {
        iVar3 = intersect_uint16_cardinality(array1->array,s_a,array2->array,s_b);
        return iVar3;
      }
      iVar3 = intersect_vector16_cardinality(array1->array,s_a,array2->array,s_b);
      return iVar3;
    }
    small = array2->array;
    large = array1->array;
    size_l = s_a;
  }
  iVar3 = intersect_skewed_uint16_cardinality(small,s_b,large,size_l);
  return iVar3;
}

Assistant:

int array_container_intersection_cardinality(const array_container_t *array1,
                                             const array_container_t *array2) {
    int32_t card_1 = array1->cardinality, card_2 = array2->cardinality;
    const int threshold = 64;  // subject to tuning
    if (card_1 * threshold < card_2) {
        return intersect_skewed_uint16_cardinality(array1->array, card_1,
                                                   array2->array, card_2);
    } else if (card_2 * threshold < card_1) {
        return intersect_skewed_uint16_cardinality(array2->array, card_2,
                                                   array1->array, card_1);
    } else {
#if CROARING_IS_X64
        if (croaring_hardware_support() & ROARING_SUPPORTS_AVX2) {
            return intersect_vector16_cardinality(array1->array, card_1,
                                                  array2->array, card_2);
        } else {
            return intersect_uint16_cardinality(array1->array, card_1,
                                                array2->array, card_2);
        }
#else
        return intersect_uint16_cardinality(array1->array, card_1,
                                            array2->array, card_2);
#endif
    }
}